

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::generate_netstd_struct_definition
          (t_netstd_generator *this,ostream *out,t_struct *tstruct,bool is_exception,bool in_class,
          bool is_result)

{
  int *piVar1;
  t_field *ptVar2;
  pointer pcVar3;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  iterator iVar6;
  ostream *poVar7;
  ostream *poVar8;
  t_type *type;
  long *plVar9;
  undefined7 in_register_00000009;
  size_type *psVar10;
  pointer pptVar11;
  t_struct *ptVar12;
  char *pcVar13;
  t_netstd_generator *ptVar14;
  undefined7 in_register_00000081;
  bool bVar15;
  long lVar16;
  string local_1f0;
  ostream *local_1d0;
  string local_1c8;
  t_struct *local_1a8;
  undefined4 local_1a0;
  uint local_19c;
  string local_198;
  string sharp_struct_name;
  string local_150;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_1a0 = (undefined4)CONCAT71(in_register_00000009,is_exception);
  if ((int)CONCAT71(in_register_00000081,in_class) == 0) {
    start_netstd_namespace(this,out);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  generate_netstd_doc(this,out,(t_doc *)tstruct);
  for (pptVar11 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      pptVar11 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar11 = pptVar11 + 1) {
    collect_extensions_types(this,(*pptVar11)->type_);
  }
  iVar5 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  prepare_member_name_mapping
            (this,tstruct,&tstruct->members_,(string *)CONCAT44(extraout_var,iVar5));
  if (this->serialize_ == false) {
    if (this->wcf_ != true || (byte)local_1a0 != '\0') goto LAB_002baa94;
  }
  else if ((byte)local_1a0 != '\0') goto LAB_002baa94;
  t_generator::indent_abi_cxx11_(&sharp_struct_name,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,sharp_struct_name._M_dataplus._M_p,sharp_struct_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[DataContract(Namespace=\"",0x19);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->wcf_namespace_)._M_dataplus._M_p,
                      (this->wcf_namespace_)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"\")]",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sharp_struct_name._M_dataplus._M_p != &sharp_struct_name.field_2) {
    operator_delete(sharp_struct_name._M_dataplus._M_p);
  }
LAB_002baa94:
  sharp_struct_name._M_dataplus._M_p = (pointer)&sharp_struct_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&sharp_struct_name,"final","");
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(tstruct->super_t_type).annotations_._M_t,&sharp_struct_name);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sharp_struct_name._M_dataplus._M_p != &sharp_struct_name.field_2) {
    operator_delete(sharp_struct_name._M_dataplus._M_p);
  }
  type_name_abi_cxx11_(&sharp_struct_name,this,&tstruct->super_t_type,false);
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  local_1d0 = out;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public ",7);
  pcVar13 = "sealed ";
  lVar16 = 7;
  if ((_Rb_tree_header *)iVar6._M_node ==
      &(tstruct->super_t_type).annotations_._M_t._M_impl.super__Rb_tree_header) {
    pcVar13 = "";
    lVar16 = 0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar13,lVar16);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"partial class ",0xe);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,sharp_struct_name._M_dataplus._M_p,sharp_struct_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," : ",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  poVar7 = local_1d0;
  if ((byte)local_1a0 != '\0') {
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0,"TException, ",0xc);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"TBase",5);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar11 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_1a8 = tstruct;
  if (pptVar11 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      if ((*pptVar11)->req_ != T_REQUIRED) {
        t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,"private ",8);
        ptVar2 = *pptVar11;
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_","");
        declare_field(&local_1c8,this,ptVar2,false,&local_50);
        poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        tstruct = local_1a8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
      }
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar7 = local_1d0;
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1d0,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar11 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar11 ==
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_19c = 0;
    bVar15 = false;
  }
  else {
    bVar15 = false;
    local_19c = 0;
    do {
      generate_netstd_doc(this,poVar7,*pptVar11);
      generate_property(this,poVar7,*pptVar11,true,true);
      local_19c = local_19c & 0xff;
      if ((*pptVar11)->req_ == T_REQUIRED) {
        local_19c = 1;
      }
      else {
        bVar15 = true;
      }
      pptVar11 = pptVar11 + 1;
      tstruct = local_1a8;
    } while (pptVar11 !=
             (local_1a8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  if (bVar15) {
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((this->serialize_ != false) || (this->wcf_ == true)) {
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[DataMember(Order = 1)]",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
    }
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"public Isset __isset;",0x15);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((this->serialize_ != false) || (this->wcf_ == true)) {
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"[DataContract]",0xe);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
    }
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public struct Isset",0x13);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar11 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (pptVar11 !=
        (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if ((*pptVar11)->req_ != T_REQUIRED) {
          if ((this->serialize_ != false) || (this->wcf_ == true)) {
            t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"[DataMember]",0xc);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
          }
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public bool ",0xc);
          pcVar3 = ((*pptVar11)->name_)._M_dataplus._M_p;
          local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_70,pcVar3,pcVar3 + ((*pptVar11)->name_)._M_string_length);
          ptVar14 = this;
          normalize_name(&local_198,this,&local_70,false);
          get_isset_name(&local_1c8,ptVar14,&local_198);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_70._M_dataplus._M_p != &local_70.field_2) {
            operator_delete(local_70._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
        }
        pptVar11 = pptVar11 + 1;
      } while (pptVar11 !=
               (local_1a8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar7 = local_1d0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    tstruct = local_1a8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if ((this->serialize_ != false) || (this->wcf_ == true)) {
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,"#region XmlSerializer support",0x1d);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      pptVar11 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (pptVar11 !=
          (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        do {
          if ((*pptVar11)->req_ != T_REQUIRED) {
            t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,"public bool ShouldSerialize",0x1b);
            prop_name_abi_cxx11_(&local_1c8,this,*pptVar11,false);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()",2);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                                ::endl_abi_cxx11_._M_string_length);
            t_generator::indent_abi_cxx11_(&local_198,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + 1;
            t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"return __isset.",0xf);
            local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
            pcVar3 = ((*pptVar11)->name_)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_110,pcVar3,pcVar3 + ((*pptVar11)->name_)._M_string_length);
            ptVar14 = this;
            normalize_name(&local_198,this,&local_110,false);
            get_isset_name(&local_1c8,ptVar14,&local_198);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_198._M_dataplus._M_p != &local_198.field_2) {
              operator_delete(local_198._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_110._M_dataplus._M_p != &local_110.field_2) {
              operator_delete(local_110._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
            *piVar1 = *piVar1 + -1;
            t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,"}",1);
            poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,
                                ::endl_abi_cxx11_._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length)
            ;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
          }
          pptVar11 = pptVar11 + 1;
        } while (pptVar11 !=
                 (local_1a8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      }
      t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
      poVar7 = local_1d0;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
      tstruct = local_1a8;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,"#endregion XmlSerializer support",0x20);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,
                          ::endl_abi_cxx11_._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
    }
  }
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public ",7);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,sharp_struct_name._M_dataplus._M_p,sharp_struct_name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"()",2);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_1c8,(t_generator *)this);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  pptVar11 = (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar11 !=
      (tstruct->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    do {
      type = resolve_typedef((*pptVar11)->type_);
      ptVar2 = *pptVar11;
      if (ptVar2->value_ != (t_const_value *)0x0) {
        if (ptVar2->req_ == T_REQUIRED) {
          prop_name_abi_cxx11_(&local_1f0,this,*pptVar11,false);
          plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_1f0,0,(char *)0x0,0x38cdaf);
          local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
          psVar10 = (size_type *)(plVar9 + 2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*plVar9 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)psVar10) {
            local_150.field_2._M_allocated_capacity = *psVar10;
            local_150.field_2._8_8_ = plVar9[3];
          }
          else {
            local_150.field_2._M_allocated_capacity = *psVar10;
            local_150._M_dataplus._M_p = (pointer)*plVar9;
          }
          local_150._M_string_length = plVar9[1];
          *plVar9 = (long)psVar10;
          plVar9[1] = 0;
          *(undefined1 *)(plVar9 + 2) = 0;
          print_const_value(this,local_1d0,&local_150,type,(*pptVar11)->value_,true,true,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_dataplus._M_p != &local_150.field_2) {
            operator_delete(local_150._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) goto LAB_002bba4f;
        }
        else {
          std::operator+(&local_f0,"this._",&ptVar2->name_);
          print_const_value(this,local_1d0,&local_f0,type,(*pptVar11)->value_,true,true,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"this.__isset.",0xd);
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          pcVar3 = ((*pptVar11)->name_)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_130,pcVar3,pcVar3 + ((*pptVar11)->name_)._M_string_length);
          ptVar14 = this;
          normalize_name(&local_198,this,&local_130,false);
          get_isset_name(&local_1c8,ptVar14,&local_198);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = true;",8);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_130._M_dataplus._M_p != &local_130.field_2) {
            operator_delete(local_130._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
LAB_002bba4f:
            operator_delete(local_1f0._M_dataplus._M_p);
          }
        }
      }
      pptVar11 = pptVar11 + 1;
    } while (pptVar11 !=
             (local_1a8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
             .super__Vector_impl_data._M_finish);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar7 = local_1d0;
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  ptVar12 = local_1a8;
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if ((local_19c & 1) != 0) {
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"public ",7);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,sharp_struct_name._M_dataplus._M_p,sharp_struct_name._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"(",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    pptVar11 = (ptVar12->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (pptVar11 !=
        (ptVar12->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar15 = true;
      do {
        if ((*pptVar11)->req_ == T_REQUIRED) {
          if (bVar15) {
            bVar15 = false;
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>(local_1d0,", ",2);
          }
          type_name_abi_cxx11_(&local_1f0,this,(*pptVar11)->type_,true);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," ",1);
          pcVar3 = ((*pptVar11)->name_)._M_dataplus._M_p;
          local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_90,pcVar3,pcVar3 + ((*pptVar11)->name_)._M_string_length);
          normalize_name(&local_1c8,this,&local_90,false);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
        }
        pptVar11 = pptVar11 + 1;
      } while (pptVar11 !=
               (local_1a8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    poVar7 = local_1d0;
    std::__ostream_insert<char,std::char_traits<char>>(local_1d0,") : this()",10);
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    ptVar12 = local_1a8;
    poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,"{",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + 1;
    pptVar11 = (ptVar12->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    if (pptVar11 !=
        (ptVar12->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      do {
        if ((*pptVar11)->req_ == T_REQUIRED) {
          t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,"this.",5);
          prop_name_abi_cxx11_(&local_1c8,this,*pptVar11,false);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," = ",3);
          pcVar3 = ((*pptVar11)->name_)._M_dataplus._M_p;
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_b0,pcVar3,pcVar3 + ((*pptVar11)->name_)._M_string_length);
          normalize_name(&local_198,this,&local_b0,false);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,local_198._M_dataplus._M_p,local_198._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,";",1);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
            operator_delete(local_1f0._M_dataplus._M_p);
          }
        }
        pptVar11 = pptVar11 + 1;
      } while (pptVar11 !=
               (local_1a8->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
               _M_impl.super__Vector_impl_data._M_finish);
    }
    piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
    *piVar1 = *piVar1 + -1;
    t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
    poVar7 = local_1d0;
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1d0,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
    ptVar12 = local_1a8;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length
                       );
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,sharp_struct_name._M_dataplus._M_p,
             sharp_struct_name._M_dataplus._M_p + sharp_struct_name._M_string_length);
  generate_netstd_deepcopy_method(this,poVar7,ptVar12,&local_d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  generate_netstd_struct_reader(this,poVar7,ptVar12);
  if (is_result) {
    generate_netstd_struct_result_writer(this,poVar7,ptVar12);
  }
  else {
    generate_netstd_struct_writer(this,poVar7,ptVar12);
  }
  generate_netstd_struct_equals(this,poVar7,ptVar12);
  generate_netstd_struct_hashcode(this,poVar7,ptVar12);
  generate_netstd_struct_tostring(this,poVar7,ptVar12);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_1f0,(t_generator *)this);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,local_1f0._M_dataplus._M_p,local_1f0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"}",1);
  poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar8,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  bVar4 = (byte)local_1a0;
  if (this->serialize_ == false) {
    bVar4 = this->wcf_ & (byte)local_1a0;
  }
  if (bVar4 != 0) {
    generate_netstd_wcffault(this,poVar7,ptVar12);
  }
  cleanup_member_name_mapping(this,ptVar12);
  if ((!in_class) && ((this->namespace_name_)._M_string_length != 0)) {
    t_oop_generator::scope_down(&this->super_t_oop_generator,poVar7);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sharp_struct_name._M_dataplus._M_p != &sharp_struct_name.field_2) {
    operator_delete(sharp_struct_name._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_definition(ostream& out, t_struct* tstruct, bool is_exception, bool in_class, bool is_result)
{
    if (!in_class)
    {
        start_netstd_namespace(out);
    }

    out << endl;

    generate_netstd_doc(out, tstruct);
    collect_extensions_types(tstruct);
    prepare_member_name_mapping(tstruct);

    if ((is_serialize_enabled() || is_wcf_enabled()) && !is_exception)
    {
        out << indent() << "[DataContract(Namespace=\"" << wcf_namespace_ << "\")]" << endl;
    }

    bool is_final = tstruct->annotations_.find("final") != tstruct->annotations_.end();

    string sharp_struct_name = type_name(tstruct, false);

    out << indent() << "public " << (is_final ? "sealed " : "") << "partial class " << sharp_struct_name << " : ";

    if (is_exception)
    {
        out << "TException, ";
    }

    out << "TBase" << endl
        << indent() << "{" << endl;
    indent_up();

    const vector<t_field*>& members = tstruct->get_members();
    vector<t_field*>::const_iterator m_iter;

    // make private members with public Properties
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        // if the field is required, then we use auto-properties
        if (!field_is_required((*m_iter)))
        {
            out << indent() << "private " << declare_field(*m_iter, false, "_") << endl;
        }
    }
    out << endl;

    bool has_non_required_fields = false;
    bool has_required_fields = false;
    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        generate_netstd_doc(out, *m_iter);
        generate_property(out, *m_iter, true, true);
        bool is_required = field_is_required((*m_iter));
        if (is_required)
        {
            has_required_fields = true;
    }
        else
        {
            has_non_required_fields = true;
        }
    }

    bool generate_isset = has_non_required_fields;
    if (generate_isset)
    {
        out << endl;
        if (is_serialize_enabled() || is_wcf_enabled())
        {
            out << indent() << "[DataMember(Order = 1)]" << endl;
        }
        out << indent() << "public Isset __isset;" << endl;
        if (is_serialize_enabled() || is_wcf_enabled())
        {
            out << indent() << "[DataContract]" << endl;
        }

        out << indent() << "public struct Isset" << endl
            << indent() << "{" << endl;
        indent_up();

        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            bool is_required = field_is_required((*m_iter));
            // if it is required, don't need Isset for that variable
            // if it is not required, if it has a default value, we need to generate Isset
            if (!is_required)
            {
                if (is_serialize_enabled() || is_wcf_enabled())
                {
                    out << indent() << "[DataMember]" << endl;
                }
                out << indent() << "public bool " << get_isset_name(normalize_name((*m_iter)->get_name())) << ";" << endl;
            }
        }

        indent_down();
        out << indent() << "}" << endl << endl;

        if (generate_isset && (is_serialize_enabled() || is_wcf_enabled()))
        {
            out << indent() << "#region XmlSerializer support" << endl << endl;

            for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
            {
                bool is_required = field_is_required(*m_iter);
                // if it is required, don't need Isset for that variable
                // if it is not required, if it has a default value, we need to generate Isset
                if (!is_required)
                {
                    out << indent() << "public bool ShouldSerialize" << prop_name(*m_iter) << "()" << endl
                        << indent() << "{" << endl;
                    indent_up();
                    out << indent() << "return __isset." << get_isset_name(normalize_name((*m_iter)->get_name())) << ";" << endl;
                    indent_down();
                    out << indent() << "}" << endl << endl;
                }
            }

            out << indent() << "#endregion XmlSerializer support" << endl << endl;
        }
    }

    // We always want a default, no argument constructor for Reading
    out << indent() << "public " << sharp_struct_name << "()" << endl
        << indent() << "{" << endl;
    indent_up();

    for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
    {
        t_type* t = (*m_iter)->get_type();
        t = resolve_typedef(t);

        if ((*m_iter)->get_value() != nullptr)
        {
            if (field_is_required((*m_iter)))
            {
                print_const_value(out, "this." + prop_name(*m_iter), t, (*m_iter)->get_value(), true, true);
            }
            else
            {
                print_const_value(out, "this._" + (*m_iter)->get_name(), t, (*m_iter)->get_value(), true, true);
                // Optionals with defaults are marked set
                out << indent() << "this.__isset." << get_isset_name(normalize_name((*m_iter)->get_name())) << " = true;" << endl;
            }
        }
    }
    indent_down();
    out << indent() << "}" << endl << endl;

    // if we have required fields, we add that CTOR too
    if (has_required_fields)
    {
        out << indent() << "public " << sharp_struct_name << "(";
        bool first = true;
        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            if (field_is_required(*m_iter))
            {
                if (first)
                {
                    first = false;
                }
                else
                {
                    out << ", ";
                }
                out << type_name((*m_iter)->get_type()) << " " << normalize_name((*m_iter)->get_name());
            }
        }
        out << ") : this()" << endl
            << indent() << "{" << endl;
        indent_up();

        for (m_iter = members.begin(); m_iter != members.end(); ++m_iter)
        {
            if (field_is_required(*m_iter))
            {
                out << indent() << "this." << prop_name(*m_iter) << " = " << normalize_name((*m_iter)->get_name()) << ";" << endl;
            }
        }

        indent_down();
        out << indent() << "}" << endl << endl;
    }

    // DeepCopy()
    generate_netstd_deepcopy_method(out, tstruct, sharp_struct_name);

    generate_netstd_struct_reader(out, tstruct);
    if (is_result)
    {
        generate_netstd_struct_result_writer(out, tstruct);
    }
    else
    {
        generate_netstd_struct_writer(out, tstruct);
    }
    generate_netstd_struct_equals(out, tstruct);
    generate_netstd_struct_hashcode(out, tstruct);
    generate_netstd_struct_tostring(out, tstruct);

    indent_down();
    out << indent() << "}" << endl << endl;

    // generate a corresponding WCF fault to wrap the exception
    if ((is_serialize_enabled() || is_wcf_enabled()) && is_exception)
    {
        generate_netstd_wcffault(out, tstruct);
    }

    cleanup_member_name_mapping(tstruct);
    if (!in_class)
    {
        end_netstd_namespace(out);
    }
}